

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::Average(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc)

{
  size_t sVar1;
  ImageChannelValues *pIVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar5;
  long lVar6;
  size_t sVar7;
  int x;
  ulong uVar8;
  allocator_type local_91;
  ImageChannelValues *local_90;
  long local_88;
  WrapMode2D local_80;
  vector<double,_std::allocator<double>_> sum;
  ImageChannelValues v;
  
  v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.memoryResource =
       (memory_resource *)0x0;
  local_90 = __return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            (&sum,(desc->offset).nStored,
             (value_type_conflict3 *)
             &v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,&local_91);
  TVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  lVar6 = 0;
  while (pIVar2 = local_90, lVar6 < (long)TVar3 >> 0x20) {
    local_88 = lVar6;
    for (uVar8 = 0; (long)uVar8 < (long)TVar3.x; uVar8 = uVar8 + 1) {
      WrapMode2D::WrapMode2D(&local_80,Clamp);
      GetChannels((ImageChannelValues *)
                  &v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,this,
                  (Point2i)(lVar6 << 0x20 | uVar8),desc,local_80);
      sVar1 = (desc->offset).nStored;
      paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
      if (v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
          (float *)0x0) {
        paVar4 = &v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2;
      }
      for (sVar7 = 0; sVar1 != sVar7; sVar7 = sVar7 + 1) {
        sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar7] =
             (double)paVar4->fixed[sVar7] +
             sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[sVar7];
      }
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                (&v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
      TVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    lVar6 = local_88 + 1;
  }
  ImageChannelValues::ImageChannelValues(local_90,(desc->offset).nStored,0.0);
  paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
            *)(pIVar2->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
  sVar1 = (desc->offset).nStored;
  paVar5 = &(pIVar2->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).
            field_2;
  if (paVar4 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)0x0) {
    paVar5 = paVar4;
  }
  for (sVar7 = 0; sVar1 != sVar7; sVar7 = sVar7 + 1) {
    TVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    paVar5->fixed[sVar7] =
         (float)(sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar7] / (double)(TVar3.y * TVar3.x));
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sum.super__Vector_base<double,_std::allocator<double>_>);
  return pIVar2;
}

Assistant:

ImageChannelValues Image::Average(const ImageChannelDesc &desc) const {
    std::vector<double> sum(desc.size(), 0.);

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            for (int c = 0; c < desc.size(); ++c)
                sum[c] += v[c];
        }

    ImageChannelValues average(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        average[c] = sum[c] / (Resolution().x * Resolution().y);
    return average;
}